

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O2

void __thiscall pbrt::ProgressReporter::Done(ProgressReporter *this)

{
  bool bVar1;
  bool fa;
  
  if (this->quiet == false) {
    fa = false;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (&this->exitThread,&fa,true,memory_order_seq_cst);
    if (bVar1) {
      LOCK();
      (this->workDone).super___atomic_base<long>._M_i = this->totalWork;
      UNLOCK();
      LOCK();
      (this->exitThread)._M_base._M_i = true;
      UNLOCK();
      if ((this->updateThread)._M_id._M_thread != 0) {
        std::thread::join();
      }
      putchar(10);
    }
  }
  return;
}

Assistant:

void ProgressReporter::Done() {
    if (!quiet) {
#ifdef PBRT_BUILD_GPU_RENDERER
        if (gpuEvents.size()) {
            CHECK_EQ(gpuEventsLaunchedOffset.load(), gpuEvents.size());
            while (gpuEventsFinishedOffset < gpuEventsLaunchedOffset) {
                cudaError_t err =
                    cudaEventSynchronize(gpuEvents[gpuEventsFinishedOffset]);
                if (err != cudaSuccess)
                    LOG_FATAL("CUDA error: %s", cudaGetErrorString(err));
            }
            workDone = gpuEventsFinishedOffset;
        }
#endif

        // Only let one thread shut things down.
        bool fa = false;
        if (exitThread.compare_exchange_strong(fa, true)) {
            workDone = totalWork;
            exitThread = true;
            if (updateThread.joinable())
                updateThread.join();
            printf("\n");
        }
    }
}